

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

String * __thiscall
nigel::Token::toString_abi_cxx11_(String *__return_storage_ptr__,Token *this,bool extended)

{
  u8 uVar1;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  allocator local_ba;
  allocator local_b9;
  allocator local_b8;
  allocator local_b7;
  allocator local_b6;
  allocator local_b5;
  allocator local_b4;
  allocator local_b3;
  allocator local_b2;
  allocator local_b1;
  allocator local_b0;
  allocator local_af;
  allocator local_ae;
  allocator local_ad;
  allocator local_ac;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  undefined1 local_a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator local_71;
  allocator local_70;
  allocator local_6f;
  allocator local_6e;
  allocator local_6d;
  allocator local_6c;
  allocator local_6b;
  allocator local_6a;
  allocator local_69;
  allocator local_68;
  allocator local_67;
  allocator local_66;
  allocator local_65;
  allocator local_64;
  allocator local_63;
  allocator local_62;
  allocator local_61;
  allocator local_60;
  allocator local_5f;
  allocator local_5e;
  allocator local_5d;
  allocator local_5c;
  allocator local_5b;
  allocator local_5a;
  allocator local_59;
  allocator local_58;
  allocator local_57;
  allocator local_56;
  allocator local_55;
  allocator local_54;
  allocator local_53;
  allocator local_52;
  allocator local_51;
  shared_ptr<const_nigel::Token_Operator> local_50;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [19];
  allocator local_1a;
  byte local_19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_18;
  bool extended_local;
  Token *this_local;
  
  local_19 = extended;
  _Stack_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  this_local = (Token *)__return_storage_ptr__;
  if (this->type == eof) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"_!EOF!_",&local_1a);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  }
  else if (this->type == ppEnd) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"PP-END",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else if (this->type == function) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"fn",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  else if (this->type == type_byte) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"byte",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  }
  else if (this->type == type_int) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
  }
  else if (this->type == unsigned_attr) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"unsigned",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else if (this->type == fast_attr) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"fast",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
  }
  else if (this->type == norm_attr) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"norm",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
  }
  else if (this->type == type_ptr) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"ptr",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
  }
  else if (this->type == cf_if) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"if",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
  }
  else if (this->type == cf_else) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"else",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
  }
  else if (this->type == cf_while) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"while",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
  }
  else if (this->type == cf_for) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"for",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
  }
  else if (this->type == cf_do) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"do",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else if (this->type == cf_return) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"return",&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  }
  else if (this->type == cf_break) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"break",&local_3b);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
  }
  else if (this->type == dy_new) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"new",&local_3c);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c);
  }
  else if (this->type == dy_delete) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"delete",&local_3d);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d);
  }
  else if (this->type == literalTrue) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"true",&local_3e);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e);
  }
  else if (this->type == literalFalse) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"false",&local_3f);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f);
  }
  else if (this->type == operatorToken) {
    as<nigel::Token_Operator>((Token *)&local_50);
    peVar2 = std::
             __shared_ptr_access<const_nigel::Token_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_nigel::Token_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_50);
    pcVar4 = "";
    if ((local_19 & 1) != 0) {
      pcVar4 = "\t\tas unknown operator";
    }
    std::operator+(__return_storage_ptr__,&peVar2->operatorToken,pcVar4);
    std::shared_ptr<const_nigel::Token_Operator>::~shared_ptr(&local_50);
  }
  else if (this->type == op_add) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"+",&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  else if (this->type == op_sub) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"-",&local_52);
    std::allocator<char>::~allocator((allocator<char> *)&local_52);
  }
  else if (this->type == op_mul) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"*",&local_53);
    std::allocator<char>::~allocator((allocator<char> *)&local_53);
  }
  else if (this->type == op_div) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"/",&local_54);
    std::allocator<char>::~allocator((allocator<char> *)&local_54);
  }
  else if (this->type == op_mod) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"%",&local_55);
    std::allocator<char>::~allocator((allocator<char> *)&local_55);
  }
  else if (this->type == op_add_set) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"+=",&local_56);
    std::allocator<char>::~allocator((allocator<char> *)&local_56);
  }
  else if (this->type == op_sub_set) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"-=",&local_57);
    std::allocator<char>::~allocator((allocator<char> *)&local_57);
  }
  else if (this->type == op_mul_set) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"*=",&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_58);
  }
  else if (this->type == op_div_set) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"/=",&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  else if (this->type == op_mod_set) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"%=",&local_5a);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a);
  }
  else if (this->type == op_set) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"=",&local_5b);
    std::allocator<char>::~allocator((allocator<char> *)&local_5b);
  }
  else if (this->type == op_eql) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"==",&local_5c);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c);
  }
  else if (this->type == op_not_eql) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"!=",&local_5d);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d);
  }
  else if (this->type == op_more) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,">",&local_5e);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e);
  }
  else if (this->type == op_less) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<",&local_5f);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f);
  }
  else if (this->type == op_more_eql) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,">=",&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_60);
  }
  else if (this->type == op_less_eql) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<=",&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  else if (this->type == op_shift_left) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<<",&local_62);
    std::allocator<char>::~allocator((allocator<char> *)&local_62);
  }
  else if (this->type == op_shift_right) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,">>",&local_63);
    std::allocator<char>::~allocator((allocator<char> *)&local_63);
  }
  else if (this->type == op_shift_left_set) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"<<=",&local_64);
    std::allocator<char>::~allocator((allocator<char> *)&local_64);
  }
  else if (this->type == op_shift_right_set) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,">>=",&local_65);
    std::allocator<char>::~allocator((allocator<char> *)&local_65);
  }
  else if (this->type == op_not) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"!",&local_66);
    std::allocator<char>::~allocator((allocator<char> *)&local_66);
  }
  else if (this->type == op_and) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"&",&local_67);
    std::allocator<char>::~allocator((allocator<char> *)&local_67);
  }
  else if (this->type == op_and_set) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"&=",&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_68);
  }
  else if (this->type == op_and_log) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"&&",&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  else if (this->type == op_or) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"|",&local_6a);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a);
  }
  else if (this->type == op_or_set) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"|=",&local_6b);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b);
  }
  else if (this->type == op_or_log) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"||",&local_6c);
    std::allocator<char>::~allocator((allocator<char> *)&local_6c);
  }
  else if (this->type == op_xor) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"^",&local_6d);
    std::allocator<char>::~allocator((allocator<char> *)&local_6d);
  }
  else if (this->type == op_xor_set) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"^=",&local_6e);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e);
  }
  else if (this->type == op_inv) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"~",&local_6f);
    std::allocator<char>::~allocator((allocator<char> *)&local_6f);
  }
  else if (this->type == op_inc) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"++",&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_70);
  }
  else if (this->type == op_dec) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"--",&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  else if (this->type == dividingToken) {
    as<nigel::Token_DividingToken>((Token *)local_a8);
    peVar3 = std::
             __shared_ptr_access<const_nigel::Token_DividingToken,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_nigel::Token_DividingToken,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8);
    uVar1 = peVar3->token;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_a8 + 0x10),1,uVar1,&local_a9);
    pcVar4 = "";
    if ((local_19 & 1) != 0) {
      pcVar4 = "\t\tas unknown divider token";
    }
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a8 + 0x10),pcVar4);
    std::__cxx11::string::~string((string *)(local_a8 + 0x10));
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::shared_ptr<const_nigel::Token_DividingToken>::~shared_ptr
              ((shared_ptr<const_nigel::Token_DividingToken> *)local_a8);
  }
  else if (this->type == tok_dollar) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"$",&local_aa);
    std::allocator<char>::~allocator((allocator<char> *)&local_aa);
  }
  else if (this->type == tok_hash) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"#",&local_ab);
    std::allocator<char>::~allocator((allocator<char> *)&local_ab);
  }
  else if (this->type == tok_parenthesis_open) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"(",&local_ac);
    std::allocator<char>::~allocator((allocator<char> *)&local_ac);
  }
  else if (this->type == tok_parenthesis_close) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,")",&local_ad);
    std::allocator<char>::~allocator((allocator<char> *)&local_ad);
  }
  else if (this->type == tok_bracket_open) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"[",&local_ae);
    std::allocator<char>::~allocator((allocator<char> *)&local_ae);
  }
  else if (this->type == tok_bracket_close) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"]",&local_af);
    std::allocator<char>::~allocator((allocator<char> *)&local_af);
  }
  else if (this->type == tok_brace_open) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"{",&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b0);
  }
  else if (this->type == tok_brace_close) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"}",&local_b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  else if (this->type == tok_comma) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,",",&local_b2);
    std::allocator<char>::~allocator((allocator<char> *)&local_b2);
  }
  else if (this->type == tok_period) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,".",&local_b3);
    std::allocator<char>::~allocator((allocator<char> *)&local_b3);
  }
  else if (this->type == tok_colon) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,":",&local_b4);
    std::allocator<char>::~allocator((allocator<char> *)&local_b4);
  }
  else if (this->type == tok_semicolon) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,";",&local_b5);
    std::allocator<char>::~allocator((allocator<char> *)&local_b5);
  }
  else if (this->type == tok_questionmark) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"?",&local_b6);
    std::allocator<char>::~allocator((allocator<char> *)&local_b6);
  }
  else if (this->type == tok_at) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"@",&local_b7);
    std::allocator<char>::~allocator((allocator<char> *)&local_b7);
  }
  else if (this->type == tok_backslash) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\\",&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b8);
  }
  else if (this->type == tok_grave) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"`",&local_b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"-!-UNKNOWN-!-",&local_ba);
    std::allocator<char>::~allocator((allocator<char> *)&local_ba);
  }
  return __return_storage_ptr__;
}

Assistant:

String Token::toString( bool extended ) const
	{
		if( type == Token::Type::eof ) return "_!EOF!_";
		else if( type == Token::Type::ppEnd ) return "PP-END";
		else if( type == Token::Type::function ) return "fn";
		else if( type == Token::Type::type_byte ) return "byte";
		else if( type == Token::Type::type_int ) return "int";
		else if( type == Token::Type::unsigned_attr ) return "unsigned";
		else if( type == Token::Type::fast_attr ) return "fast";
		else if( type == Token::Type::norm_attr ) return "norm";
		else if( type == Token::Type::type_ptr ) return "ptr";
		else if( type == Token::Type::cf_if ) return "if";
		else if( type == Token::Type::cf_else ) return "else";
		else if( type == Token::Type::cf_while ) return "while";
		else if( type == Token::Type::cf_for ) return "for";
		else if( type == Token::Type::cf_do ) return "do";
		else if( type == Token::Type::cf_return ) return "return";
		else if( type == Token::Type::cf_break ) return "break";
		else if( type == Token::Type::dy_new ) return "new";
		else if( type == Token::Type::dy_delete ) return "delete";
		else if( type == Token::Type::literalTrue ) return "true";
		else if( type == Token::Type::literalFalse ) return "false";
		else if( type == Token::Type::operatorToken ) return as<Token_Operator>()->operatorToken + ( extended ? "\t\tas unknown operator" : "" );
		else if( type == Token::Type::op_add ) return "+";
		else if( type == Token::Type::op_sub ) return "-";
		else if( type == Token::Type::op_mul ) return "*";
		else if( type == Token::Type::op_div ) return "/";
		else if( type == Token::Type::op_mod ) return "%";
		else if( type == Token::Type::op_add_set ) return "+=";
		else if( type == Token::Type::op_sub_set ) return "-=";
		else if( type == Token::Type::op_mul_set ) return "*=";
		else if( type == Token::Type::op_div_set ) return "/=";
		else if( type == Token::Type::op_mod_set ) return "%=";
		else if( type == Token::Type::op_set ) return "=";
		else if( type == Token::Type::op_eql ) return "==";
		else if( type == Token::Type::op_not_eql ) return "!=";
		else if( type == Token::Type::op_more ) return ">";
		else if( type == Token::Type::op_less ) return "<";
		else if( type == Token::Type::op_more_eql ) return ">=";
		else if( type == Token::Type::op_less_eql ) return "<=";
		else if( type == Token::Type::op_shift_left ) return "<<";
		else if( type == Token::Type::op_shift_right ) return ">>";
		else if( type == Token::Type::op_shift_left_set ) return "<<=";
		else if( type == Token::Type::op_shift_right_set ) return ">>=";
		else if( type == Token::Type::op_not ) return "!";
		else if( type == Token::Type::op_and ) return "&";
		else if( type == Token::Type::op_and_set ) return "&=";
		else if( type == Token::Type::op_and_log ) return "&&";
		else if( type == Token::Type::op_or ) return "|";
		else if( type == Token::Type::op_or_set ) return "|=";
		else if( type == Token::Type::op_or_log ) return "||";
		else if( type == Token::Type::op_xor ) return "^";
		else if( type == Token::Type::op_xor_set ) return "^=";
		else if( type == Token::Type::op_inv ) return "~";
		else if( type == Token::Type::op_inc ) return "++";
		else if( type == Token::Type::op_dec ) return "--";
		else if( type == Token::Type::dividingToken ) return String( 1, as<Token_DividingToken>()->token ) + ( extended ? "\t\tas unknown divider token" : "" );
		else if( type == Token::Type::tok_dollar ) return "$";
		else if( type == Token::Type::tok_hash ) return "#";
		else if( type == Token::Type::tok_parenthesis_open ) return "(";
		else if( type == Token::Type::tok_parenthesis_close ) return ")";
		else if( type == Token::Type::tok_bracket_open ) return "[";
		else if( type == Token::Type::tok_bracket_close ) return "]";
		else if( type == Token::Type::tok_brace_open ) return "{";
		else if( type == Token::Type::tok_brace_close ) return "}";
		else if( type == Token::Type::tok_comma ) return ",";
		else if( type == Token::Type::tok_period ) return ".";
		else if( type == Token::Type::tok_colon ) return ":";
		else if( type == Token::Type::tok_semicolon ) return ";";
		else if( type == Token::Type::tok_questionmark ) return "?";
		else if( type == Token::Type::tok_at ) return "@";
		else if( type == Token::Type::tok_backslash ) return "\\";
		else if( type == Token::Type::tok_grave ) return "`";
		else return "-!-UNKNOWN-!-";
	}